

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_perform_list(connectdata *conn)

{
  void *pvVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x40) == 0) {
    if (*(char **)((long)pvVar1 + 8) == (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)("");
    }
    else {
      pcVar3 = imap_atom(*(char **)((long)pvVar1 + 8),true);
    }
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = imap_sendf(conn,"LIST \"%s\" *",pcVar3);
    (*Curl_cfree)(pcVar3);
  }
  else {
    pcVar3 = "";
    if (*(char **)((long)pvVar1 + 0x48) != (char *)0x0) {
      pcVar3 = *(char **)((long)pvVar1 + 0x48);
    }
    CVar2 = imap_sendf(conn,"%s%s",*(long *)((long)pvVar1 + 0x40),pcVar3);
  }
  if (CVar2 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_LIST;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_perform_list(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct IMAP *imap = data->req.protop;

  if(imap->custom)
    /* Send the custom request */
    result = imap_sendf(conn, "%s%s", imap->custom,
                        imap->custom_params ? imap->custom_params : "");
  else {
    /* Make sure the mailbox is in the correct atom format if necessary */
    char *mailbox = imap->mailbox ? imap_atom(imap->mailbox, true)
                                  : strdup("");
    if(!mailbox)
      return CURLE_OUT_OF_MEMORY;

    /* Send the LIST command */
    result = imap_sendf(conn, "LIST \"%s\" *", mailbox);

    free(mailbox);
  }

  if(!result)
    state(conn, IMAP_LIST);

  return result;
}